

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_tt__sort_edges_ins_sort(nk_tt__edge *p,int n)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  nk_tt__edge *pnVar7;
  nk_tt__edge *pnVar8;
  int c;
  nk_tt__edge *b;
  nk_tt__edge *a;
  nk_tt__edge t;
  int j;
  int i;
  int n_local;
  nk_tt__edge *p_local;
  
  for (t.invert = 1; t.invert < n; t.invert = t.invert + 1) {
    pnVar7 = p + t.invert;
    uVar2 = pnVar7->x0;
    uVar3 = pnVar7->y0;
    fVar5 = pnVar7->x1;
    fVar6 = pnVar7->y1;
    iVar1 = pnVar7->invert;
    t.y1 = (float)t.invert;
    while ((0 < (int)t.y1 && ((float)uVar3 < p[(int)t.y1 + -1].y0))) {
      pnVar7 = p + (int)t.y1;
      pnVar8 = p + ((int)t.y1 + -1);
      fVar4 = pnVar8->y0;
      pnVar7->x0 = pnVar8->x0;
      pnVar7->y0 = fVar4;
      fVar4 = pnVar8->y1;
      pnVar7->x1 = pnVar8->x1;
      pnVar7->y1 = fVar4;
      pnVar7->invert = pnVar8->invert;
      t.y1 = (float)((int)t.y1 + -1);
    }
    if ((float)t.invert != t.y1) {
      pnVar7 = p + (int)t.y1;
      pnVar7->x0 = (float)uVar2;
      pnVar7->y0 = (float)uVar3;
      pnVar7->x1 = fVar5;
      pnVar7->y1 = fVar6;
      pnVar7->invert = iVar1;
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_tt__sort_edges_ins_sort(struct nk_tt__edge *p, int n)
{
    int i,j;
    #define NK_TT__COMPARE(a,b)  ((a)->y0 < (b)->y0)
    for (i=1; i < n; ++i) {
        struct nk_tt__edge t = p[i], *a = &t;
        j = i;
        while (j > 0) {
            struct nk_tt__edge *b = &p[j-1];
            int c = NK_TT__COMPARE(a,b);
            if (!c) break;
            p[j] = p[j-1];
            --j;
        }
        if (i != j)
            p[j] = t;
    }
}